

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ret0.cxx
# Opt level: O3

int main(int ac,char **av)

{
  bool bVar1;
  size_type sVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string logfile;
  string logarg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  callargs;
  string exename;
  string arg;
  CommandLineArguments args;
  allocator_type local_181;
  undefined8 local_180;
  char **local_178;
  string local_170;
  ulong local_150;
  undefined1 *local_148;
  char *local_140;
  undefined1 local_138;
  undefined7 uStack_137;
  ulong local_128;
  undefined8 local_120;
  undefined1 local_118 [32];
  long *local_f8 [2];
  long local_e8 [2];
  undefined8 local_d8;
  ulong local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  CommandLineArguments local_48;
  
  cmsys::Encoding::CommandLineArguments::Main(&local_48,ac,av);
  uVar3 = cmsys::Encoding::CommandLineArguments::argc(&local_48);
  local_178 = cmsys::Encoding::CommandLineArguments::argv(&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,*local_178,(allocator<char> *)&local_c8);
  local_148 = &local_138;
  local_140 = (char *)0x0;
  local_138 = 0;
  lVar4 = std::__cxx11::string::find((char *)local_f8,0x25d004,0);
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)local_f8,0x25d019,0);
    if (lVar4 == -1) {
      lVar4 = std::__cxx11::string::find((char *)local_f8,0x25d020,0);
      if (lVar4 == -1) {
        uVar10 = 0;
        lVar4 = std::__cxx11::string::find((char *)local_f8,0x25d026,0);
        if (lVar4 == -1) {
          local_180 = 0;
        }
        else {
          uVar10 = 1;
          uVar5 = std::__cxx11::string::_M_replace((ulong)&local_148,0,local_140,0x25d034);
          local_180 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
        }
      }
      else {
        uVar10 = 0;
        uVar5 = std::__cxx11::string::_M_replace((ulong)&local_148,0,local_140,0x25d023);
        local_180 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
      }
      goto LAB_00110361;
    }
    pcVar6 = "-log-file=";
  }
  else {
    pcVar6 = "--log-file=";
  }
  uVar10 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_148,0,local_140,(ulong)pcVar6);
  local_180 = 0;
LAB_00110361:
  iVar7 = 0;
  if (local_140 != (char *)0x0) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    local_170._M_string_length = 0;
    local_170.field_2._M_local_buf[0] = '\0';
    local_d8 = uVar10;
    if (1 < (int)uVar3) {
      local_d0 = (ulong)(uVar3 - 1);
      uVar9 = (ulong)uVar3;
      local_120 = 0;
      uVar8 = 1;
      local_150 = uVar9;
      local_128 = (ulong)uVar3;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,local_178[uVar8],(allocator<char> *)local_118);
        lVar4 = std::__cxx11::string::find((char *)&local_c8,(ulong)local_148,0);
        sVar2 = local_170._M_string_length;
        bVar1 = true;
        if (lVar4 == 0) {
          if ((byte)local_180 == '\0') {
            std::__cxx11::string::substr((ulong)local_118,(ulong)&local_c8);
            std::__cxx11::string::operator=((string *)&local_170,(string *)local_118);
            if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_118._16_8_)->_M_p + 1));
            }
          }
          else if (local_d0 == uVar8) {
            local_120 = 1;
            bVar1 = false;
          }
          else {
            pcVar6 = local_178[uVar8 + 1];
            strlen(pcVar6);
            uVar9 = local_150;
            std::__cxx11::string::_M_replace((ulong)&local_170,0,(char *)sVar2,(ulong)pcVar6);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar1) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,
                            CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                                     local_170.field_2._M_local_buf[0]) + 1);
          }
          iVar7 = (int)local_120;
          goto LAB_00110758;
        }
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
      iVar7 = 1;
      if (1 < (int)local_128) {
        uVar9 = 1;
        uVar8 = 1;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,local_178[uVar8],(allocator<char> *)local_118);
          lVar4 = std::__cxx11::string::find((char *)&local_c8,0x25d03f,0);
          if (lVar4 == 0) {
            uVar9 = uVar8 & 0xffffffff;
          }
          iVar7 = (int)uVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          uVar8 = uVar8 + 1;
        } while (local_150 != uVar8);
      }
      uVar9 = local_128;
      if ((char *)local_170._M_string_length != (char *)0x0) {
        cmsys::SystemTools::Touch(&local_170,true);
        iVar7 = iVar7 + (uint)(byte)local_180 + 1;
        if (((byte)local_d8 & iVar7 < (int)uVar9) == 1) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/usr/bin/cmake","");
          local_a8[0] = local_98;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"-E","");
          local_88[0] = local_78;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"env","");
          std::operator+(&local_68,"PSEUDO_LOGFILE=",&local_170);
          __l._M_len = 4;
          __l._M_array = &local_c8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_118,__l,&local_181);
          lVar4 = -0x80;
          paVar11 = &local_68.field_2;
          do {
            if (paVar11 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar11->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar11->_M_allocated_capacity)[-2],
                              paVar11->_M_allocated_capacity + 1);
            }
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar11->_M_allocated_capacity + -4);
            lVar4 = lVar4 + 0x20;
          } while (lVar4 != 0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<char_const*const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_118,
                     local_118._8_8_,local_178 + iVar7);
          cmSystemTools::RunSingleCommand
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_118,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                     (cmDuration)0x0,Auto);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_118);
        }
      }
    }
    iVar7 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                               local_170.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_00110758:
  if (local_148 != &local_138) {
    operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_48);
  return iVar7;
}

Assistant:

int main(int ac, char** av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  int argc = args.argc();
  const char* const* argv = args.argv();

  std::string exename = argv[0];
  std::string logarg;
  bool nextarg = false;
  // execute the part after the last argument?
  // the logfile path gets passed as environment variable PSEUDO_LOGFILE
  bool exec = false;

  if (exename.find("valgrind") != std::string::npos) {
    logarg = "--log-file=";
  } else if (exename.find("purify") != std::string::npos) {
#ifdef _WIN32
    logarg = "/SAVETEXTDATA=";
#else
    logarg = "-log-file=";
#endif
  } else if (exename.find("BC") != std::string::npos) {
    nextarg = true;
    logarg = "/X";
  } else if (exename.find("cuda-memcheck") != std::string::npos) {
    nextarg = true;
    exec = true;
    logarg = "--log-file";
  }

  if (!logarg.empty()) {
    std::string logfile;
    for (int i = 1; i < argc; i++) {
      std::string arg = argv[i];
      if (arg.find(logarg) == 0) {
        if (nextarg) {
          if (i == argc - 1) {
            return 1; // invalid command line
          }
          logfile = argv[i + 1];
        } else {
          logfile = arg.substr(logarg.length());
        }
        // keep searching, it may be overridden later to provoke an error
      }
    }

    // find the last argument position
    int lastarg_pos = 1;
    for (int i = 1; i < argc; ++i) {
      std::string arg = argv[i];
      if (arg.find("--") == 0) {
        lastarg_pos = i;
      }
    }

    if (!logfile.empty()) {
      cmSystemTools::Touch(logfile, true);
      // execute everything after the last argument with additional environment
      int callarg_pos = lastarg_pos + (nextarg ? 2 : 1);
      if (exec && callarg_pos < argc) {
        std::vector<std::string> callargs{ CMAKE_COMMAND, "-E", "env",
                                           "PSEUDO_LOGFILE=" + logfile };
        callargs.insert(callargs.end(), &argv[callarg_pos], &argv[argc]);
        cmSystemTools::RunSingleCommand(callargs);
      }
    }
  }

  return RETVAL;
}